

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O1

int32_t helper_cvttss2si_x86_64(CPUX86State *env,ZMMReg *s)

{
  byte bVar1;
  byte bVar2;
  float32 a;
  int32_t iVar3;
  
  a = s->_s_ZMMReg[0];
  bVar1 = (env->sse_status).float_exception_flags;
  (env->sse_status).float_exception_flags = '\0';
  iVar3 = float32_to_int32_round_to_zero_x86_64(a,&env->sse_status);
  bVar2 = (env->sse_status).float_exception_flags;
  if ((bVar2 & 1) != 0) {
    iVar3 = -0x80000000;
  }
  (env->sse_status).float_exception_flags = bVar1 | bVar2;
  return iVar3;
}

Assistant:

int32_t helper_cvttss2si(CPUX86State *env, ZMMReg *s)
{
    return x86_float32_to_int32_round_to_zero(s->ZMM_S(0), &env->sse_status);
}